

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListenerContainer.h
# Opt level: O0

void __thiscall
ListenerContainer<FooListener>::removeListener
          (ListenerContainer<FooListener> *this,FooListener *listener)

{
  bool bVar1;
  FooListener **ppFVar2;
  iterator local_58;
  FooListener *local_50;
  FooListener *lnode;
  undefined1 local_40 [16];
  iterator i;
  AutoLock lock;
  FooListener *listener_local;
  ListenerContainer<FooListener> *this_local;
  
  AutoLock::AutoLock((AutoLock *)&i,&this->mMutex);
  JetHead::list<FooListener_*>::begin((list<FooListener_*> *)(local_40 + 8));
  do {
    JetHead::list<FooListener_*>::end((list<FooListener_*> *)local_40);
    bVar1 = JetHead::list<FooListener_*>::iterator::operator!=
                      ((iterator *)(local_40 + 8),(iterator *)local_40);
    JetHead::list<FooListener_*>::iterator::~iterator((iterator *)local_40);
    if (!bVar1) {
      lnode._4_4_ = 2;
LAB_00102dd3:
      JetHead::list<FooListener_*>::iterator::~iterator((iterator *)(local_40 + 8));
      if (lnode._4_4_ == 2) {
        lnode._4_4_ = 0;
      }
      AutoLock::~AutoLock((AutoLock *)&i);
      return;
    }
    ppFVar2 = JetHead::list<FooListener_*>::iterator::operator*((iterator *)(local_40 + 8));
    local_50 = *ppFVar2;
    if (local_50 == listener) {
      JetHead::list<FooListener_*>::iterator::erase(&local_58);
      JetHead::list<FooListener_*>::iterator::~iterator(&local_58);
      lnode._4_4_ = 1;
      goto LAB_00102dd3;
    }
    JetHead::list<FooListener_*>::iterator::operator++((iterator *)(local_40 + 8));
  } while( true );
}

Assistant:

void removeListener(ListenerType *listener)
	{
		AutoLock lock(mMutex);
		
		// The "typename" is necessary here because templates
		// are dirty: the compiler is not yet "aware" of
		// list<T>::iterator as a class type, so in some
		// horrible sense the compiler thinks that
		// "JetHead::list<ListenerType*>::iterator might be a
		// full statement (or variable declaration) on its
		// own.  Adding the "typename" hint allows the compile
		// to realize that the next token is a type (and this to compile).
		for (typename JetHead::list< ListenerType *>::iterator i = mListenerList.begin();
			 i != mListenerList.end(); ++i)
		{
			ListenerType* lnode = *i;
			
			if (lnode == listener)
			{
				i.erase();
				return;
			}
		}
	}